

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim.c
# Opt level: O0

object * stringToUrl(byteObject *from)

{
  object *poVar1;
  uint uVar2;
  int sz;
  char *pcVar3;
  long lVar4;
  char local_49;
  char c;
  char *to_ptr;
  char *from_ptr;
  int local_30;
  int fsize;
  int bad_chars;
  int new_size;
  byteObject *newStr;
  int j;
  int i;
  byteObject *from_local;
  
  local_30 = 0;
  uVar2 = (uint)(from->header >> 2) & 0x3fffffff;
  for (newStr._4_4_ = 0; newStr._4_4_ < (int)uVar2; newStr._4_4_ = newStr._4_4_ + 1) {
    pcVar3 = strchr(badURLChars,(int)*(char *)((long)&from[1].header + (long)newStr._4_4_));
    if (pcVar3 != (char *)0x0) {
      local_30 = local_30 + 1;
    }
  }
  lVar4 = (long)rootTop;
  rootTop = rootTop + 1;
  rootStack[lVar4] = (object *)from;
  sz = uVar2 + local_30 * 2;
  from_local = (byteObject *)gcialloc(sz);
  ((object *)from_local)->class = StringClass;
  rootTop = rootTop + -1;
  poVar1 = rootStack[rootTop];
  if (from_local == (byteObject *)0x0) {
    error_impl("stringToUrl",0x2d4,"stringToUrl(): unable to allocate string!");
    from_local = (byteObject *)nilObject;
  }
  else {
    newStr._0_4_ = 0;
    for (newStr._4_4_ = 0; newStr._4_4_ < (int)uVar2 && (int)newStr < sz;
        newStr._4_4_ = newStr._4_4_ + 1) {
      pcVar3 = strchr(badURLChars,(int)*(char *)((long)&poVar1[1].header + (long)newStr._4_4_));
      if (pcVar3 == (char *)0x0) {
        local_49 = *(char *)((long)&poVar1[1].header + (long)newStr._4_4_);
        if (local_49 == ' ') {
          local_49 = '+';
        }
        *(char *)((long)&((object *)from_local)[1].header + (long)(int)newStr) = local_49;
        newStr._0_4_ = (int)newStr + 1;
      }
      else {
        *(undefined1 *)((long)&((object *)from_local)[1].header + (long)(int)newStr) = 0x25;
        *(char *)((long)&((object *)from_local)[1].header + (long)((int)newStr + 1)) =
             hexDigits[(int)((int)*(char *)((long)&poVar1[1].header + (long)newStr._4_4_) >> 4 & 0xf
                            )];
        *(char *)((long)&((object *)from_local)[1].header + (long)((int)newStr + 2)) =
             hexDigits[(int)((int)*(char *)((long)&poVar1[1].header + (long)newStr._4_4_) & 0xf)];
        newStr._0_4_ = (int)newStr + 3;
      }
    }
  }
  return (object *)from_local;
}

Assistant:

struct object * stringToUrl(struct byteObject * from)
{
    int i,j;
    struct byteObject *newStr = NULL;
    int new_size = 0;
    int bad_chars = 0;
    int fsize = SIZE(from);
    char *from_ptr = (char *)bytePtr(from);
    char *to_ptr = NULL;
    char c;

    /* count bad chars */
    for(i=0; i<fsize; i++) {
        if(NULL != strchr(badURLChars,from_ptr[i])) {
            bad_chars++;
        }
    }

    /* we're going to allocate, so we need to make sure that nothing can
    move out from underneath us. */
    rootStack[rootTop++] = (struct object *)from;

    /* allocate enough space for the new string.  Note that
    the size is increased by two for every bad char.  This is
    because a URL-safe replacement is a "%" char followed by two
    hex digits. The "%" replaces the original character and the two
    hex digits are added. */

    new_size = fsize + (bad_chars * 2);
    newStr = (struct byteObject *)gcialloc(new_size);
    newStr->class = StringClass;

    /* OK, now done with allocation, get the from string back */
    from = (struct byteObject *)rootStack[--rootTop];
    from_ptr = (char *)from->bytes;

    /* did allocation succeed? */
    if(NULL == newStr) {
        error("stringToUrl(): unable to allocate string!");
        return nilObject;
    }

    /* copy the characters */
    j = 0;
    to_ptr = (char *)newStr->bytes;

    for(i=0; i<fsize && j<new_size; i++) {
        if(strchr(badURLChars,from_ptr[i])) {
            to_ptr[j++] = '%';
            to_ptr[j++] = hexDigits[0x0F & ((from_ptr[i])>>4)];
            to_ptr[j++] = hexDigits[0x0F & (from_ptr[i])];
        } else {
            /* convert spaces to plusses too, but this doesn't change the string size. */
            c = from_ptr[i];

            if(c == ' ')
                c = '+';
            to_ptr[j++] = c;
        }
    }

    return (struct object *)newStr;
}